

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O1

float compute_error_of_weight_set_2planes
                (endpoints_and_weights *eai1,endpoints_and_weights *eai2,decimation_info *di,
                float *dec_weight_quant_uvalue_plane1,float *dec_weight_quant_uvalue_plane2)

{
  uint8_t *puVar1;
  float *pfVar2;
  uint8_t *puVar3;
  float *pfVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [32];
  float fVar19;
  undefined1 in_ZMM2 [64];
  undefined1 auVar20 [32];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 in_ZMM4 [64];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar32 [32];
  
  uVar12 = (ulong)di->texel_count;
  if (uVar12 != 0) {
    auVar17 = ZEXT1664(ZEXT816(0) << 0x40);
    if (di->max_texel_weight_count < 3) {
      if (di->max_texel_weight_count == 2) {
        lVar14 = 0x1d8;
        do {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)((long)di + lVar14 + -0xd8);
          auVar18 = vpmovzxbd_avx2(auVar10);
          auVar11 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
          auVar20 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar11);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(di->texel_weight_count + lVar14 + -0x20);
          auVar30 = vpmovzxbd_avx2(auVar9);
          auVar11 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
          auVar31 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar11);
          auVar11 = *(undefined1 (*) [32])(di->texel_weight_count + lVar14 * 4 + 0x40);
          in_ZMM4 = ZEXT3264(auVar11);
          puVar1 = di->texel_weights_tr[3] + lVar14 * 4 + 0x38;
          fVar21 = auVar31._0_4_ * *(float *)puVar1;
          fVar22 = auVar31._4_4_ * *(float *)(puVar1 + 4);
          auVar28._4_4_ = fVar22;
          auVar28._0_4_ = fVar21;
          fVar23 = auVar31._8_4_ * *(float *)(puVar1 + 8);
          auVar28._8_4_ = fVar23;
          fVar24 = auVar31._12_4_ * *(float *)(puVar1 + 0xc);
          auVar28._12_4_ = fVar24;
          fVar25 = auVar31._16_4_ * *(float *)(puVar1 + 0x10);
          auVar28._16_4_ = fVar25;
          fVar26 = auVar31._20_4_ * *(float *)(puVar1 + 0x14);
          auVar28._20_4_ = fVar26;
          fVar27 = auVar31._24_4_ * *(float *)(puVar1 + 0x18);
          auVar28._24_4_ = fVar27;
          auVar28._28_4_ = auVar31._28_4_;
          auVar32._0_4_ = auVar20._0_4_ * auVar11._0_4_ + fVar21;
          auVar32._4_4_ = auVar20._4_4_ * auVar11._4_4_ + fVar22;
          auVar32._8_4_ = auVar20._8_4_ * auVar11._8_4_ + fVar23;
          auVar32._12_4_ = auVar20._12_4_ * auVar11._12_4_ + fVar24;
          auVar32._16_4_ = auVar20._16_4_ * auVar11._16_4_ + fVar25;
          auVar32._20_4_ = auVar20._20_4_ * auVar11._20_4_ + fVar26;
          auVar32._24_4_ = auVar20._24_4_ * auVar11._24_4_ + fVar27;
          auVar32._28_4_ = auVar20._28_4_ + auVar31._28_4_;
          auVar20 = vsubps_avx(auVar32,*(undefined1 (*) [32])((long)eai1 + lVar14 * 4 + -0x6c0));
          pfVar2 = (float *)((long)eai1 + lVar14 * 4 + -0x360);
          auVar28 = vpcmpeqd_avx2(auVar28,auVar28);
          auVar32 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar28);
          auVar28 = vpcmpeqd_avx2(auVar18,auVar18);
          auVar28 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar28);
          fVar21 = *(float *)puVar1 * auVar28._0_4_;
          fVar22 = *(float *)(puVar1 + 4) * auVar28._4_4_;
          fVar23 = *(float *)(puVar1 + 8) * auVar28._8_4_;
          fVar24 = *(float *)(puVar1 + 0xc) * auVar28._12_4_;
          fVar25 = *(float *)(puVar1 + 0x10) * auVar28._16_4_;
          fVar26 = *(float *)(puVar1 + 0x14) * auVar28._20_4_;
          fVar27 = *(float *)(puVar1 + 0x18) * auVar28._24_4_;
          in_ZMM2 = ZEXT3264(CONCAT428(auVar30._28_4_,
                                       CONCAT424(fVar27,CONCAT420(fVar26,CONCAT416(fVar25,CONCAT412(
                                                  fVar24,CONCAT48(fVar23,CONCAT44(fVar22,fVar21)))))
                                                )));
          auVar18._0_4_ = auVar11._0_4_ * auVar32._0_4_ + fVar21;
          auVar18._4_4_ = auVar11._4_4_ * auVar32._4_4_ + fVar22;
          auVar18._8_4_ = auVar11._8_4_ * auVar32._8_4_ + fVar23;
          auVar18._12_4_ = auVar11._12_4_ * auVar32._12_4_ + fVar24;
          auVar18._16_4_ = auVar11._16_4_ * auVar32._16_4_ + fVar25;
          auVar18._20_4_ = auVar11._20_4_ * auVar32._20_4_ + fVar26;
          auVar18._24_4_ = auVar11._24_4_ * auVar32._24_4_ + fVar27;
          auVar18._28_4_ = auVar30._28_4_ + 0.0;
          auVar11 = vsubps_avx(auVar18,*(undefined1 (*) [32])((long)eai2 + lVar14 * 4 + -0x6c0));
          pfVar4 = (float *)((long)eai2 + lVar14 * 4 + -0x360);
          fVar21 = auVar20._4_4_ * auVar20._4_4_ * pfVar2[1] +
                   auVar11._4_4_ * auVar11._4_4_ * pfVar4[1];
          auVar15._0_4_ =
               auVar20._16_4_ * auVar20._16_4_ * pfVar2[4] +
               auVar11._16_4_ * auVar11._16_4_ * pfVar4[4] +
               auVar17._0_4_ +
               auVar20._0_4_ * auVar20._0_4_ * *pfVar2 + auVar11._0_4_ * auVar11._0_4_ * *pfVar4;
          auVar15._4_4_ = fVar21 + auVar17._4_4_ + fVar21;
          auVar15._8_4_ =
               auVar20._24_4_ * auVar20._24_4_ * pfVar2[6] +
               auVar11._24_4_ * auVar11._24_4_ * pfVar4[6] +
               auVar17._8_4_ +
               auVar20._8_4_ * auVar20._8_4_ * pfVar2[2] + auVar11._8_4_ * auVar11._8_4_ * pfVar4[2]
          ;
          auVar15._12_4_ =
               auVar20._28_4_ + auVar11._28_4_ +
               auVar17._12_4_ +
               auVar20._12_4_ * auVar20._12_4_ * pfVar2[3] +
               auVar11._12_4_ * auVar11._12_4_ * pfVar4[3];
          auVar17 = ZEXT1664(auVar15);
          uVar13 = lVar14 - 0x1d0;
          lVar14 = lVar14 + 8;
        } while (uVar13 < uVar12);
      }
      else {
        uVar13 = 0;
        do {
          auVar11 = vsubps_avx(*(undefined1 (*) [32])(dec_weight_quant_uvalue_plane1 + uVar13),
                               *(undefined1 (*) [32])(eai1->weights + uVar13));
          pfVar2 = eai1->weight_error_scale + uVar13;
          auVar20 = vsubps_avx(*(undefined1 (*) [32])(dec_weight_quant_uvalue_plane2 + uVar13),
                               *(undefined1 (*) [32])(eai2->weights + uVar13));
          pfVar4 = eai2->weight_error_scale + uVar13;
          fVar21 = auVar11._4_4_ * auVar11._4_4_ * pfVar2[1] +
                   auVar20._4_4_ * auVar20._4_4_ * pfVar4[1];
          auVar15._0_4_ =
               auVar11._16_4_ * auVar11._16_4_ * pfVar2[4] +
               auVar20._16_4_ * auVar20._16_4_ * pfVar4[4] +
               auVar17._0_4_ +
               auVar11._0_4_ * auVar11._0_4_ * *pfVar2 + auVar20._0_4_ * auVar20._0_4_ * *pfVar4;
          auVar15._4_4_ = fVar21 + auVar17._4_4_ + fVar21;
          auVar15._8_4_ =
               auVar11._24_4_ * auVar11._24_4_ * pfVar2[6] +
               auVar20._24_4_ * auVar20._24_4_ * pfVar4[6] +
               auVar17._8_4_ +
               auVar11._8_4_ * auVar11._8_4_ * pfVar2[2] + auVar20._8_4_ * auVar20._8_4_ * pfVar4[2]
          ;
          auVar15._12_4_ =
               auVar11._28_4_ + auVar20._28_4_ +
               auVar17._12_4_ +
               auVar11._12_4_ * auVar11._12_4_ * pfVar2[3] +
               auVar20._12_4_ * auVar20._12_4_ * pfVar4[3];
          auVar17 = ZEXT1664(auVar15);
          uVar13 = uVar13 + 8;
        } while (uVar13 < uVar12);
      }
    }
    else {
      lVar14 = 0x388;
      do {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *(ulong *)((long)di + lVar14 + -0x288);
        auVar18 = vpmovzxbd_avx2(auVar5);
        auVar11 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
        auVar20 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar11);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)((long)di + lVar14 + -0x1b0);
        vpmovzxbd_avx2(auVar6);
        auVar11 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
        auVar28 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar11);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(ulong *)((long)di + lVar14 + -0xd8);
        vpmovzxbd_avx2(auVar7);
        auVar11 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
        auVar30 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar11);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)(di->texel_weight_count + lVar14 + -0x20);
        auVar11 = vpmovzxbd_avx2(auVar8);
        in_ZMM6 = ZEXT3264(auVar11);
        auVar11 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
        auVar32 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar11);
        auVar11 = *(undefined1 (*) [32])((long)di + lVar14 * 4 + -0x660);
        in_ZMM8 = ZEXT3264(auVar11);
        pfVar2 = (float *)((long)di + lVar14 * 4 + -0x300);
        puVar1 = di->texel_weight_count + lVar14 * 4 + 0x40;
        puVar3 = di->texel_weights_tr[3] + lVar14 * 4 + 0x38;
        auVar29._0_4_ = *(float *)puVar1 * auVar30._0_4_ + auVar32._0_4_ * *(float *)puVar3;
        auVar29._4_4_ =
             *(float *)(puVar1 + 4) * auVar30._4_4_ + auVar32._4_4_ * *(float *)(puVar3 + 4);
        auVar29._8_4_ =
             *(float *)(puVar1 + 8) * auVar30._8_4_ + auVar32._8_4_ * *(float *)(puVar3 + 8);
        auVar29._12_4_ =
             *(float *)(puVar1 + 0xc) * auVar30._12_4_ + auVar32._12_4_ * *(float *)(puVar3 + 0xc);
        auVar29._16_4_ =
             *(float *)(puVar1 + 0x10) * auVar30._16_4_ + auVar32._16_4_ * *(float *)(puVar3 + 0x10)
        ;
        auVar29._20_4_ =
             *(float *)(puVar1 + 0x14) * auVar30._20_4_ + auVar32._20_4_ * *(float *)(puVar3 + 0x14)
        ;
        auVar29._24_4_ =
             *(float *)(puVar1 + 0x18) * auVar30._24_4_ + auVar32._24_4_ * *(float *)(puVar3 + 0x18)
        ;
        auVar29._28_4_ = auVar28._28_4_ + auVar30._28_4_;
        auVar31._0_4_ = auVar11._0_4_ * auVar20._0_4_ + *pfVar2 * auVar28._0_4_ + auVar29._0_4_;
        auVar31._4_4_ = auVar11._4_4_ * auVar20._4_4_ + pfVar2[1] * auVar28._4_4_ + auVar29._4_4_;
        auVar31._8_4_ = auVar11._8_4_ * auVar20._8_4_ + pfVar2[2] * auVar28._8_4_ + auVar29._8_4_;
        auVar31._12_4_ =
             auVar11._12_4_ * auVar20._12_4_ + pfVar2[3] * auVar28._12_4_ + auVar29._12_4_;
        auVar31._16_4_ =
             auVar11._16_4_ * auVar20._16_4_ + pfVar2[4] * auVar28._16_4_ + auVar29._16_4_;
        auVar31._20_4_ =
             auVar11._20_4_ * auVar20._20_4_ + pfVar2[5] * auVar28._20_4_ + auVar29._20_4_;
        auVar31._24_4_ =
             auVar11._24_4_ * auVar20._24_4_ + pfVar2[6] * auVar28._24_4_ + auVar29._24_4_;
        auVar31._28_4_ = auVar20._28_4_ + auVar28._28_4_ + auVar29._28_4_;
        auVar20 = vsubps_avx(auVar31,*(undefined1 (*) [32])((long)eai1 + lVar14 * 4 + -0xd80));
        pfVar4 = (float *)((long)eai1 + lVar14 * 4 + -0xa20);
        auVar28 = vpcmpeqd_avx2(auVar29,auVar29);
        auVar31 = vgatherdps(ZEXT832(0) << 0x20,auVar28);
        auVar28 = vpcmpeqd_avx2(auVar18,auVar18);
        auVar32 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar28);
        auVar28 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar18 = vgatherdps(ZEXT832(0) << 0x20,auVar28);
        auVar28 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar28 = vgatherdps(ZEXT832(0) << 0x20,auVar28);
        fVar21 = *(float *)puVar3 * auVar28._0_4_;
        fVar22 = *(float *)(puVar3 + 4) * auVar28._4_4_;
        fVar23 = *(float *)(puVar3 + 8) * auVar28._8_4_;
        fVar24 = *(float *)(puVar3 + 0xc) * auVar28._12_4_;
        fVar25 = *(float *)(puVar3 + 0x10) * auVar28._16_4_;
        fVar26 = *(float *)(puVar3 + 0x14) * auVar28._20_4_;
        fVar27 = *(float *)(puVar3 + 0x18) * auVar28._24_4_;
        in_ZMM4 = ZEXT3264(CONCAT428(auVar28._28_4_,
                                     CONCAT424(fVar27,CONCAT420(fVar26,CONCAT416(fVar25,CONCAT412(
                                                  fVar24,CONCAT48(fVar23,CONCAT44(fVar22,fVar21)))))
                                              )));
        fVar21 = *(float *)puVar1 * auVar18._0_4_ + fVar21;
        fVar22 = *(float *)(puVar1 + 4) * auVar18._4_4_ + fVar22;
        fVar23 = *(float *)(puVar1 + 8) * auVar18._8_4_ + fVar23;
        fVar24 = *(float *)(puVar1 + 0xc) * auVar18._12_4_ + fVar24;
        fVar25 = *(float *)(puVar1 + 0x10) * auVar18._16_4_ + fVar25;
        fVar26 = *(float *)(puVar1 + 0x14) * auVar18._20_4_ + fVar26;
        fVar27 = *(float *)(puVar1 + 0x18) * auVar18._24_4_ + fVar27;
        fVar19 = auVar18._28_4_ + auVar28._28_4_;
        in_ZMM2 = ZEXT3264(CONCAT428(fVar19,CONCAT424(fVar27,CONCAT420(fVar26,CONCAT416(fVar25,
                                                  CONCAT412(fVar24,CONCAT48(fVar23,CONCAT44(fVar22,
                                                  fVar21))))))));
        auVar30._0_4_ = auVar11._0_4_ * auVar31._0_4_ + *pfVar2 * auVar32._0_4_ + fVar21;
        auVar30._4_4_ = auVar11._4_4_ * auVar31._4_4_ + pfVar2[1] * auVar32._4_4_ + fVar22;
        auVar30._8_4_ = auVar11._8_4_ * auVar31._8_4_ + pfVar2[2] * auVar32._8_4_ + fVar23;
        auVar30._12_4_ = auVar11._12_4_ * auVar31._12_4_ + pfVar2[3] * auVar32._12_4_ + fVar24;
        auVar30._16_4_ = auVar11._16_4_ * auVar31._16_4_ + pfVar2[4] * auVar32._16_4_ + fVar25;
        auVar30._20_4_ = auVar11._20_4_ * auVar31._20_4_ + pfVar2[5] * auVar32._20_4_ + fVar26;
        auVar30._24_4_ = auVar11._24_4_ * auVar31._24_4_ + pfVar2[6] * auVar32._24_4_ + fVar27;
        auVar30._28_4_ = auVar32._28_4_ + 0.0 + fVar19;
        auVar11 = vsubps_avx(auVar30,*(undefined1 (*) [32])((long)eai2 + lVar14 * 4 + -0xd80));
        pfVar2 = (float *)((long)eai2 + lVar14 * 4 + -0xa20);
        fVar21 = auVar20._4_4_ * auVar20._4_4_ * pfVar4[1] +
                 auVar11._4_4_ * auVar11._4_4_ * pfVar2[1];
        auVar15._0_4_ =
             auVar20._16_4_ * auVar20._16_4_ * pfVar4[4] +
             auVar11._16_4_ * auVar11._16_4_ * pfVar2[4] +
             auVar17._0_4_ +
             auVar20._0_4_ * auVar20._0_4_ * *pfVar4 + auVar11._0_4_ * auVar11._0_4_ * *pfVar2;
        auVar15._4_4_ = fVar21 + auVar17._4_4_ + fVar21;
        auVar15._8_4_ =
             auVar20._24_4_ * auVar20._24_4_ * pfVar4[6] +
             auVar11._24_4_ * auVar11._24_4_ * pfVar2[6] +
             auVar17._8_4_ +
             auVar20._8_4_ * auVar20._8_4_ * pfVar4[2] + auVar11._8_4_ * auVar11._8_4_ * pfVar2[2];
        auVar15._12_4_ =
             auVar20._28_4_ + auVar11._28_4_ +
             auVar17._12_4_ +
             auVar20._12_4_ * auVar20._12_4_ * pfVar4[3] +
             auVar11._12_4_ * auVar11._12_4_ * pfVar2[3];
        auVar17 = ZEXT1664(auVar15);
        uVar13 = lVar14 - 0x380;
        lVar14 = lVar14 + 8;
      } while (uVar13 < uVar12);
    }
    auVar10 = vshufpd_avx(auVar15,auVar15,1);
    auVar16._0_4_ = auVar15._0_4_ + auVar10._0_4_;
    auVar16._4_4_ = auVar15._4_4_ + auVar10._4_4_;
    auVar16._8_4_ = auVar15._8_4_ + auVar10._8_4_;
    auVar16._12_4_ = auVar15._12_4_ + auVar10._12_4_;
    auVar15 = vhaddps_avx(auVar16,auVar16);
    return auVar15._0_4_;
  }
  __assert_fail("texel_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                ,0x2f9,
                "float compute_error_of_weight_set_2planes(const endpoints_and_weights &, const endpoints_and_weights &, const decimation_info &, const float *, const float *)"
               );
}

Assistant:

float compute_error_of_weight_set_2planes(
	const endpoints_and_weights& eai1,
	const endpoints_and_weights& eai2,
	const decimation_info& di,
	const float* dec_weight_quant_uvalue_plane1,
	const float* dec_weight_quant_uvalue_plane2
) {
	vfloatacc error_summav = vfloatacc::zero();
	unsigned int texel_count = di.texel_count;
	promise(texel_count > 0);

	// Process SIMD-width chunks, safe to over-fetch - the extra space is zero initialized
	if (di.max_texel_weight_count > 2)
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Plane 1
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values1 = bilinear_infill_vla(di, dec_weight_quant_uvalue_plane1, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values1 = loada(eai1.weights + i);
			vfloat diff = current_values1 - actual_values1;
			vfloat error1 = diff * diff * loada(eai1.weight_error_scale + i);

			// Plane 2
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values2 = bilinear_infill_vla(di, dec_weight_quant_uvalue_plane2, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values2 = loada(eai2.weights + i);
			diff = current_values2 - actual_values2;
			vfloat error2 = diff * diff * loada(eai2.weight_error_scale + i);

			haccumulate(error_summav, error1 + error2);
		}
	}
	else if (di.max_texel_weight_count > 1)
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Plane 1
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values1 = bilinear_infill_vla_2(di, dec_weight_quant_uvalue_plane1, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values1 = loada(eai1.weights + i);
			vfloat diff = current_values1 - actual_values1;
			vfloat error1 = diff * diff * loada(eai1.weight_error_scale + i);

			// Plane 2
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values2 = bilinear_infill_vla_2(di, dec_weight_quant_uvalue_plane2, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values2 = loada(eai2.weights + i);
			diff = current_values2 - actual_values2;
			vfloat error2 = diff * diff * loada(eai2.weight_error_scale + i);

			haccumulate(error_summav, error1 + error2);
		}
	}
	else
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Plane 1
			// Load the weight set directly, without interpolation
			vfloat current_values1 = loada(dec_weight_quant_uvalue_plane1 + i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values1 = loada(eai1.weights + i);
			vfloat diff = current_values1 - actual_values1;
			vfloat error1 = diff * diff * loada(eai1.weight_error_scale + i);

			// Plane 2
			// Load the weight set directly, without interpolation
			vfloat current_values2 = loada(dec_weight_quant_uvalue_plane2 + i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values2 = loada(eai2.weights + i);
			diff = current_values2 - actual_values2;
			vfloat error2 = diff * diff * loada(eai2.weight_error_scale + i);

			haccumulate(error_summav, error1 + error2);
		}
	}

	// Resolve the final scalar accumulator sum
	return hadd_s(error_summav);
}